

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

ForwardingTypedefSymbol *
slang::ast::ForwardingTypedefSymbol::fromSyntax(Scope *scope,ClassPropertyDeclarationSyntax *syntax)

{
  short sVar1;
  _Optional_payload_base<slang::ast::Visibility> _Var2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar3;
  MemberSyntax *this;
  reference pTVar4;
  long in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDI;
  Token qual;
  iterator __end2;
  iterator __begin2;
  TokenList *__range2;
  ForwardingTypedefSymbol *result;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_ffffffffffffff68;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff70;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  short in_stack_ffffffffffffff86;
  Scope *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  _Storage<slang::ast::Visibility,_true> in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  _Optional_payload_base<slang::ast::Visibility> in_stack_ffffffffffffffb0;
  ForwardTypedefDeclarationSyntax *in_stack_ffffffffffffffb8;
  Scope *in_stack_ffffffffffffffc0;
  __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
  local_28;
  long local_20;
  ForwardingTypedefSymbol *local_18;
  long local_10;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  this = not_null<slang::syntax::MemberSyntax_*>::operator->
                   ((not_null<slang::syntax::MemberSyntax_*> *)0x57af68);
  slang::syntax::SyntaxNode::as<slang::syntax::ForwardTypedefDeclarationSyntax>
            (&this->super_SyntaxNode);
  local_18 = fromSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_20 = local_10 + 0x50;
  local_28._M_current =
       (Token *)std::span<slang::parsing::Token,_18446744073709551615UL>::begin
                          (in_stack_ffffffffffffff68);
  std::span<slang::parsing::Token,_18446744073709551615UL>::end(in_stack_ffffffffffffff78);
  while (bVar3 = __gnu_cxx::
                 operator==<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                           (in_stack_ffffffffffffff70,
                            (__normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff68), ((bVar3 ^ 0xffU) & 1) != 0) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
             ::operator*(&local_28);
    sVar1 = pTVar4->kind;
    if (sVar1 == 0xd1) {
      in_stack_ffffffffffffffac = 2;
      std::optional<slang::ast::Visibility>::optional<slang::ast::Visibility,_true>
                ((optional<slang::ast::Visibility> *)in_stack_ffffffffffffff70,
                 (Visibility *)in_stack_ffffffffffffff68);
      (local_18->visibility).super__Optional_base<slang::ast::Visibility,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::Visibility> = in_stack_ffffffffffffffb0;
    }
    else if (sVar1 == 0xf1) {
      in_stack_ffffffffffffffa0 = 1;
      std::optional<slang::ast::Visibility>::optional<slang::ast::Visibility,_true>
                ((optional<slang::ast::Visibility> *)in_stack_ffffffffffffff70,
                 (Visibility *)in_stack_ffffffffffffff68);
      _Var2._4_4_ = in_stack_ffffffffffffffa8;
      _Var2._M_payload._M_value = in_stack_ffffffffffffffa4._M_value;
      (local_18->visibility).super__Optional_base<slang::ast::Visibility,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::Visibility> = _Var2;
    }
    __gnu_cxx::
    __normal_iterator<slang::parsing::Token_*,_std::span<slang::parsing::Token,_18446744073709551615UL>_>
    ::operator++(&local_28);
    in_stack_ffffffffffffff86 = sVar1;
  }
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),local_8);
  syntax_00._M_ptr._4_4_ = in_stack_ffffffffffffffac;
  syntax_00._M_ptr._0_4_ = in_stack_ffffffffffffffa8;
  syntax_00._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffffb0._M_payload;
  syntax_00._M_extent._M_extent_value._4_1_ = in_stack_ffffffffffffffb0._M_engaged;
  syntax_00._M_extent._M_extent_value._5_3_ = in_stack_ffffffffffffffb0._5_3_;
  Symbol::setAttributes
            ((Symbol *)CONCAT44(in_stack_ffffffffffffffa4._M_value,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,syntax_00);
  return local_18;
}

Assistant:

ForwardingTypedefSymbol& ForwardingTypedefSymbol::fromSyntax(
    const Scope& scope, const ClassPropertyDeclarationSyntax& syntax) {

    auto& result = fromSyntax(scope, syntax.declaration->as<ForwardTypedefDeclarationSyntax>());
    for (Token qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::LocalKeyword:
                result.visibility = Visibility::Local;
                break;
            case TokenKind::ProtectedKeyword:
                result.visibility = Visibility::Protected;
                break;
            default:
                // Everything else is not allowed on typedefs; the parser will issue
                // a diagnostic so just ignore them here.
                break;
        }
    }

    result.setAttributes(scope, syntax.attributes);
    return result;
}